

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

primitive_feature_space * VW::export_example(vw *all,example *ec,size_t *len)

{
  byte bVar1;
  uint32_t uVar2;
  float *pfVar3;
  float *pfVar4;
  unsigned_long *puVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  primitive_feature_space *ppVar8;
  feature *pfVar9;
  uint32_t *puVar10;
  ulong uVar11;
  feature *pfVar12;
  ulong uVar13;
  long lVar14;
  features *__range2;
  
  uVar7 = (long)(ec->super_example_predict).indices._end -
          (long)(ec->super_example_predict).indices._begin;
  *len = uVar7;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar7;
  uVar11 = 0xffffffffffffffff;
  if (SUB168(auVar6 * ZEXT816(0x18),8) == 0) {
    uVar11 = SUB168(auVar6 * ZEXT816(0x18),0);
  }
  ppVar8 = (primitive_feature_space *)operator_new__(uVar11);
  puVar10 = &(all->weights).dense_weights._stride_shift;
  if (((all->weights).sparse & 1U) != 0) {
    puVar10 = &(all->weights).sparse_weights._stride_shift;
  }
  uVar2 = *puVar10;
  for (uVar11 = 0; uVar11 != uVar7; uVar11 = uVar11 + 1) {
    bVar1 = (ec->super_example_predict).indices._begin[uVar11];
    ppVar8[uVar11].name = bVar1;
    pfVar3 = (ec->super_example_predict).feature_space[bVar1].values._begin;
    pfVar4 = (ec->super_example_predict).feature_space[bVar1].values._end;
    uVar13 = (long)pfVar4 - (long)pfVar3 >> 2;
    ppVar8[uVar11].len = uVar13;
    pfVar9 = (feature *)
             operator_new__(-(ulong)(uVar13 >> 0x3c != 0) | ((long)pfVar4 - (long)pfVar3) * 4);
    if (pfVar4 != pfVar3) {
      pfVar12 = pfVar9;
      do {
        pfVar12->x = 0.0;
        pfVar12->weight_index = 0;
        pfVar12 = pfVar12 + 1;
      } while (pfVar12 != pfVar9 + uVar13);
    }
    ppVar8[uVar11].fs = pfVar9;
    puVar5 = (ec->super_example_predict).feature_space[bVar1].indicies._begin;
    for (lVar14 = 0; (float *)((long)pfVar3 + lVar14) != pfVar4; lVar14 = lVar14 + 4) {
      uVar13 = *(ulong *)((long)puVar5 + lVar14 * 2);
      (&pfVar9->x)[lVar14] = *(float *)((long)pfVar3 + lVar14);
      *(ulong *)((long)&pfVar9->weight_index + lVar14 * 4) = uVar13 >> ((byte)uVar2 & 0x3f);
    }
  }
  return ppVar8;
}

Assistant:

primitive_feature_space* export_example(vw& all, example* ec, size_t& len)
{
  len = ec->indices.size();
  primitive_feature_space* fs_ptr = new primitive_feature_space[len];

  int fs_count = 0;

  for (size_t idx = 0; idx < len; ++idx)
  {
    namespace_index i = ec->indices[idx];
    fs_ptr[fs_count].name = i;
    fs_ptr[fs_count].len = ec->feature_space[i].size();
    fs_ptr[fs_count].fs = new feature[fs_ptr[fs_count].len];

    uint32_t stride_shift = all.weights.stride_shift();
    int f_count = 0;
    for (features::iterator& f : ec->feature_space[i])
    {
      feature t = {f.value(), f.index()};
      t.weight_index >>= stride_shift;
      fs_ptr[fs_count].fs[f_count] = t;
      f_count++;
    }
    fs_count++;
  }
  return fs_ptr;
}